

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
MapIRCCommand::trigger
          (MapIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  basic_string_view<char,_std::char_traits<char>_> *args;
  char *pcVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  size_t local_148;
  char *local_140;
  basic_string_view<char,_std::char_traits<char>_> local_128 [2];
  basic_string_view<char,_std::char_traits<char>_> local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  __sv_type local_c8;
  size_t local_b8;
  char *pcStack_b0;
  long local_a8;
  Map *map;
  reference local_90;
  Server **server;
  iterator __end2;
  iterator __begin2;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range2;
  bool match;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  MapIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  args_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)nick._M_str;
  pcVar5 = channel._M_str;
  sVar6 = channel._M_len;
  lVar4 = Jupiter::IRC::Client::getChannel(source,sVar6,pcVar5);
  if (lVar4 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    bVar1 = false;
    RenX::getCore();
    RenX::Core::getServers();
    __end2 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin
                       ((vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&__begin2);
    server = (Server **)
             std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end
                       ((vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&__begin2);
    while (bVar2 = __gnu_cxx::
                   operator==<RenX::Server_**,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                             (&__end2,(__normal_iterator<RenX::Server_**,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                       *)&server), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_90 = __gnu_cxx::
                 __normal_iterator<RenX::Server_**,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                 ::operator*(&__end2);
      bVar3 = RenX::Server::isLogChanType((int)*local_90);
      if ((bVar3 & 1) != 0) {
        bVar1 = true;
        local_a8 = RenX::Server::getMap();
        local_b8 = sVar6;
        pcStack_b0 = pcVar5;
        local_f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )sv("Current Map: ",0xd);
        args = (basic_string_view<char,_std::char_traits<char>_> *)(local_a8 + 0x10);
        local_108 = sv("; GUID: ",8);
        RenX::formatGUID_abi_cxx11_((Map *)local_128);
        jessilib::
        join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                  (&local_e8,(jessilib *)local_f8._M_local_buf,args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                   local_128,args_3);
        local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e8);
        Jupiter::IRC::Client::sendMessage
                  (source,local_b8,pcStack_b0,local_c8._M_len,local_c8._M_str);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)local_128);
      }
      __gnu_cxx::
      __normal_iterator<RenX::Server_**,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
      ::operator++(&__end2);
    }
    std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector
              ((vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&__begin2);
    if (!bVar1) {
      bVar7 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
      local_148 = bVar7._M_len;
      local_140 = bVar7._M_str;
      Jupiter::IRC::Client::sendMessage(source,sVar6,pcVar5,local_148,local_140);
    }
  }
  return;
}

Assistant:

void MapIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		bool match = false;
		for (const auto& server : RenX::getCore()->getServers()) {
			if (server->isLogChanType(type)) {
				match = true;
				const RenX::Map &map = server->getMap();
				source->sendMessage(channel, jessilib::join<std::string>("Current Map: "sv, map.name, "; GUID: "sv, RenX::formatGUID(map)));
			}
		}
		if (match == false) {
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}